

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  bool bVar1;
  int iVar2;
  WorkingMode WVar3;
  uint uVar4;
  cmState *this_00;
  undefined4 extraout_var;
  cmCommand *pcVar5;
  cmake *pcVar6;
  cmDebugger *pcVar7;
  cmListFileContext *pcVar8;
  char *__rhs;
  allocator local_f9;
  undefined1 local_f8 [8];
  string error_1;
  cmDebugger *debugger_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  string error;
  bool hadNestedError;
  bool invokeSucceeded;
  cmDebugger *debugger;
  auto_ptr<cmCommand> pcmd;
  cmCommand *proto;
  cmMakefileCall local_58;
  cmMakefileCall stack_manager;
  string name;
  bool result;
  cmExecutionStatus *status_local;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  name.field_2._M_local_buf[0xf] = '\x01';
  bVar1 = IsFunctionBlocked(this,lff,status);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::string((string *)&stack_manager,(string *)lff);
    cmMakefileCall::cmMakefileCall(&local_58,this,&lff->super_cmCommandContext,status);
    this_00 = GetState(this);
    pcmd.x_ = cmState::GetCommand(this_00,(string *)&stack_manager);
    if (pcmd.x_ == (cmCommand *)0x0) {
      bVar1 = cmSystemTools::GetFatalErrorOccured();
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_f8,"Unknown CMake command \"",&local_f9);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        std::__cxx11::string::operator+=((string *)local_f8,(string *)lff);
        std::__cxx11::string::operator+=((string *)local_f8,"\".");
        IssueMessage(this,FATAL_ERROR,(string *)local_f8);
        cmSystemTools::SetFatalErrorOccured();
        std::__cxx11::string::~string((string *)local_f8);
      }
      name.field_2._M_local_buf[0xf] = bVar1;
    }
    else {
      iVar2 = (*(pcmd.x_)->_vptr_cmCommand[6])();
      ::cm::auto_ptr<cmCommand>::auto_ptr
                ((auto_ptr<cmCommand> *)&debugger,(cmCommand *)CONCAT44(extraout_var,iVar2));
      pcVar5 = ::cm::auto_ptr<cmCommand>::operator->((auto_ptr<cmCommand> *)&debugger);
      cmCommand::SetMakefile(pcVar5,this);
      bVar1 = cmSystemTools::GetFatalErrorOccured();
      if (!bVar1) {
        pcVar6 = GetCMakeInstance(this);
        bVar1 = cmake::GetTrace(pcVar6);
        if (bVar1) {
          PrintCommandTrace(this,lff);
        }
        pcVar6 = GetCMakeInstance(this);
        pcVar7 = cmake::GetDebugger(pcVar6);
        if (pcVar7 != (cmDebugger *)0x0) {
          pcVar8 = cmListFileBacktrace::Top(&this->Backtrace);
          (*pcVar7->_vptr_cmDebugger[0xc])(pcVar7,pcVar8,lff);
        }
        pcVar5 = ::cm::auto_ptr<cmCommand>::operator->((auto_ptr<cmCommand> *)&debugger);
        iVar2 = (*pcVar5->_vptr_cmCommand[2])(pcVar5,&lff->Arguments,status);
        error.field_2._M_local_buf[0xf] = (byte)iVar2 & 1;
        error.field_2._M_local_buf[0xe] = cmExecutionStatus::GetNestedError(status);
        if (((error.field_2._M_local_buf[0xf] & 1U) == 0) || ((bool)error.field_2._M_local_buf[0xe])
           ) {
          if (!(bool)error.field_2._M_local_buf[0xe]) {
            std::operator+(&local_c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack_manager," ");
            pcVar5 = ::cm::auto_ptr<cmCommand>::operator->((auto_ptr<cmCommand> *)&debugger);
            __rhs = cmCommand::GetError(pcVar5);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8,&local_c8,__rhs);
            std::__cxx11::string::~string((string *)&local_c8);
            IssueMessage(this,FATAL_ERROR,(string *)local_a8);
            std::__cxx11::string::~string((string *)local_a8);
          }
          name.field_2._M_local_buf[0xf] = '\0';
          pcVar6 = GetCMakeInstance(this);
          WVar3 = cmake::GetWorkingMode(pcVar6);
          if (WVar3 != NORMAL_MODE) {
            cmSystemTools::SetFatalErrorOccured();
          }
        }
        else {
          pcVar5 = ::cm::auto_ptr<cmCommand>::operator->((auto_ptr<cmCommand> *)&debugger);
          uVar4 = (*pcVar5->_vptr_cmCommand[5])();
          if ((uVar4 & 1) != 0) {
            debugger_1 = (cmDebugger *)
                         ::cm::auto_ptr<cmCommand>::release((auto_ptr<cmCommand> *)&debugger);
            std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::push_back
                      (&this->FinalPassCommands,(value_type *)&debugger_1);
          }
        }
        bVar1 = cmSystemTools::GetFatalErrorOccured();
        if (bVar1) {
          pcVar6 = GetCMakeInstance(this);
          pcVar7 = cmake::GetDebugger(pcVar6);
          error_1.field_2._8_8_ = pcVar7;
          if (pcVar7 != (cmDebugger *)0x0) {
            pcVar8 = cmListFileBacktrace::Top(&this->Backtrace);
            (*pcVar7->_vptr_cmDebugger[0xd])(pcVar7,pcVar8);
          }
        }
      }
      ::cm::auto_ptr<cmCommand>::~auto_ptr((auto_ptr<cmCommand> *)&debugger);
    }
    this_local._7_1_ = (bool)name.field_2._M_local_buf[0xf];
    cmMakefileCall::~cmMakefileCall(&local_58);
    std::__cxx11::string::~string((string *)&stack_manager);
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  std::string name = lff.Name;

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Lookup the command prototype.
  if (cmCommand* proto = this->GetState()->GetCommand(name)) {
    // Clone the prototype.
    CM_AUTO_PTR<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccured()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff);
      }

      if (auto debugger = this->GetCMakeInstance()->GetDebugger()) {
        debugger->PreRunHook(this->Backtrace.Top(), lff);
      }

      // Try invoking the command.
      bool invokeSucceeded = pcmd->InvokeInitialPass(lff.Arguments, status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error = name + " " + pcmd->GetError();
          this->IssueMessage(cmake::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccured();
        }
      } else if (pcmd->HasFinalPass()) {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
      }

      // If this is true here, it means the command set the fatal error flag;
      // alert the debugger
      if (cmSystemTools::GetFatalErrorOccured()) {
        if (auto debugger = this->GetCMakeInstance()->GetDebugger()) {
          debugger->ErrorHook(this->Backtrace.Top());
        }
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccured()) {
      std::string error = "Unknown CMake command \"";
      error += lff.Name;
      error += "\".";
      this->IssueMessage(cmake::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
    }
  }

  return result;
}